

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildProfiledElementCP
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,RegSlot regSlot,
          CacheId inlineCacheIndex,ProfileId profileId)

{
  code *pcVar1;
  LdLenInfo *pLVar2;
  bool bVar3;
  PropertyId propertyId_00;
  BOOL BVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  SymOpnd *srcOpnd;
  JITTimeProfileInfo *this_01;
  Func *pFVar6;
  JitProfilingInstr *pJVar7;
  ProfiledInstr *pPVar8;
  LdLenInfo *pLVar9;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar10;
  Instr *local_58;
  Instr *instr;
  bool wasNotProfiled;
  LdLenInfo *pLStack_48;
  LdLenInfo *ldLenInfo;
  ValueType arrayType;
  RegOpnd *pRStack_38;
  bool isProfiled;
  RegOpnd *dstOpnd;
  SymOpnd *fieldSymOpnd;
  PropertyId propertyId;
  CacheId inlineCacheIndex_local;
  RegSlot regSlot_local;
  RegSlot instance_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  instance_local._2_2_ = newOpcode;
  _offset_local = this;
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12d0,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  Js::OpCodeUtil::ConvertNonCallOpToNonProfiled((OpCode *)((long)&instance_local + 2));
  if (instance_local._2_2_ != LdLen_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12d4,"(newOpcode == Js::OpCode::LdLen_A)",
                       "newOpcode == Js::OpCode::LdLen_A");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId_00 = JITTimeFunctionBody::GetPropertyIdFromCacheId(this_00,inlineCacheIndex);
  srcOpnd = BuildFieldOpnd(this,instance_local._2_2_,instance,propertyId_00,0xffffffff,
                           PropertyKindData,inlineCacheIndex);
  pRStack_38 = BuildDstOpnd(this,regSlot,TyVar,false,false);
  ldLenInfo._7_1_ = profileId != 0xffff;
  ldLenInfo._4_2_ = ValueType::Uninitialized.field_0;
  pLStack_48 = (LdLenInfo *)0x0;
  bVar3 = Func::HasProfileInfo(this->m_func);
  if (bVar3) {
    this_01 = Func::GetReadOnlyProfileInfo(this->m_func);
    pLStack_48 = JITTimeProfileInfo::GetLdLenInfo(this_01,profileId);
    instr._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                  Js::LdLenInfo::GetArrayType(pLStack_48);
    ldLenInfo._4_2_ = instr._6_2_;
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)((long)&ldLenInfo + 4));
    if ((bVar3) && (bVar3 = AllowNativeArrayProfileInfo(this), !bVar3)) {
      instr._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                    ValueType::SetArrayTypeId((ValueType *)((long)&ldLenInfo + 4),TypeIds_Array);
      ldLenInfo._4_2_ = instr._4_2_;
    }
    instr._2_2_ = ldLenInfo._4_2_;
    IR::Opnd::SetValueType(&srcOpnd->super_Opnd,(ValueType)ldLenInfo._4_2_);
    pFVar6 = Func::GetTopFunc(this->m_func);
    BVar4 = Func::HasTry(pFVar6);
    if (BVar4 != 0) {
      pFVar6 = Func::GetTopFunc(this->m_func);
      bVar3 = Func::DoOptimizeTry(pFVar6);
      if (!bVar3) {
        ldLenInfo._7_1_ = 0;
      }
    }
  }
  else {
    ldLenInfo._7_1_ = 0;
  }
  instr._1_1_ = 0;
  local_58 = (Instr *)0x0;
  if ((ldLenInfo._7_1_ & 1) != 0) {
    local_58 = BuildProfiledFieldLoad
                         (this,instance_local._2_2_,pRStack_38,srcOpnd,inlineCacheIndex,
                          (bool *)((long)&instr + 1));
  }
  if (local_58 == (Instr *)0x0) {
    local_58 = IR::Instr::New(instance_local._2_2_,&pRStack_38->super_Opnd,&srcOpnd->super_Opnd,
                              this->m_func);
  }
  else {
    bVar3 = IR::Instr::IsJitProfilingInstr(local_58);
    if (bVar3) {
      pJVar7 = IR::Instr::AsJitProfilingInstr(local_58);
      pJVar7->profileId = profileId;
    }
    else {
      bVar3 = IR::Instr::IsProfiledInstr(local_58);
      pLVar2 = pLStack_48;
      if (bVar3) {
        pPVar8 = IR::Instr::AsProfiledInstr(local_58);
        pLVar9 = IR::ProfiledInstr::anon_union_8_4_88fdcd80::LdLenInfo
                           ((anon_union_8_4_88fdcd80 *)&(pPVar8->u).field_3);
        (pLVar9->arrayType).field_0 = (pLVar2->arrayType).field_0;
        pLVar9->field_1 = pLVar2->field_1;
        pPVar8 = IR::Instr::AsProfiledInstr(local_58);
        paVar10 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
                  IR::ProfiledInstr::anon_union_8_4_88fdcd80::LdLenInfo
                            ((anon_union_8_4_88fdcd80 *)&(pPVar8->u).field_3);
        *paVar10 = ldLenInfo._4_2_;
      }
    }
  }
  AddInstr(this,local_58,offset);
  if (((instr._1_1_ & 1) != 0) && (bVar3 = DoBailOnNoProfile(this), bVar3)) {
    InsertBailOnNoProfile(this,local_58);
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledElementCP(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::RegSlot regSlot, Js::CacheId inlineCacheIndex, Js::ProfileId profileId)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);

    Assert(newOpcode == Js::OpCode::LdLen_A);

    Js::PropertyId propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(inlineCacheIndex);
    IR::SymOpnd * fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, (Js::PropertyIdIndexType) - 1, PropertyKindData, inlineCacheIndex);
    IR::RegOpnd * dstOpnd = this->BuildDstOpnd(regSlot);

    bool isProfiled = (profileId != Js::Constants::NoProfileId);
    ValueType arrayType = ValueType::Uninitialized;
    const Js::LdLenInfo * ldLenInfo = nullptr;

    if (m_func->HasProfileInfo())
    {
        ldLenInfo = m_func->GetReadOnlyProfileInfo()->GetLdLenInfo(profileId);
        arrayType = (ldLenInfo->GetArrayType());
        if (arrayType.IsLikelyNativeArray() && !AllowNativeArrayProfileInfo())
        {
            // An opnd's value type will get replaced in the forward phase when it is not fixed. Store the array type in the ProfiledInstr.
            arrayType = arrayType.SetArrayTypeId(Js::TypeIds_Array);
        }

        fieldSymOpnd->SetValueType(arrayType);

        if (m_func->GetTopFunc()->HasTry() && !m_func->GetTopFunc()->DoOptimizeTry())
        {
            isProfiled = false;
        }
    }
    else
    {
        isProfiled = false;
    }
    
    bool wasNotProfiled = false;
    IR::Instr *instr = nullptr;

    if (isProfiled)
    {
        instr = this->BuildProfiledFieldLoad(newOpcode, dstOpnd, fieldSymOpnd, inlineCacheIndex, &wasNotProfiled);
    }

    if (instr == nullptr)
    {
        instr = IR::Instr::New(newOpcode, dstOpnd, fieldSymOpnd, m_func);
    }
    else if (instr->IsJitProfilingInstr())
    {
        instr->AsJitProfilingInstr()->profileId = profileId;
    }
    else if (instr->IsProfiledInstr())
    {
        instr->AsProfiledInstr()->u.LdLenInfo() = *ldLenInfo;
        instr->AsProfiledInstr()->u.LdLenInfo().arrayType = arrayType;
    }

    this->AddInstr(instr, offset);

    if (wasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}